

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

QKeySequence __thiscall QAction::shortcut(QAction *this)

{
  bool bVar1;
  QKeySequencePrivate *in_RDI;
  QActionPrivate *d;
  QKeySequencePrivate *this_00;
  
  this_00 = in_RDI;
  d_func((QAction *)0x975768);
  bVar1 = QList<QKeySequence>::isEmpty((QList<QKeySequence> *)0x97577e);
  if (bVar1) {
    QKeySequence::QKeySequence((QKeySequence *)0x97578d);
  }
  else {
    QList<QKeySequence>::first((QList<QKeySequence> *)this_00);
    QKeySequence::QKeySequence((QKeySequence *)this_00,(QKeySequence *)in_RDI);
  }
  return (QKeySequence)this_00;
}

Assistant:

QKeySequence QAction::shortcut() const
{
    Q_D(const QAction);
    if (d->shortcuts.isEmpty())
        return QKeySequence();
    return d->shortcuts.first();
}